

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

QString * __thiscall
QStringBuilder<char16_t,_QStringView>::convertTo<QString>
          (QStringBuilder<char16_t,_QStringView> *this)

{
  long lVar1;
  bool bVar2;
  DataPointer *this_00;
  QStringBuilder<char16_t,_QStringView> *in_RDI;
  long in_FS_OFFSET;
  iterator start;
  qsizetype len;
  QString *s;
  iterator d;
  type *in_stack_ffffffffffffff98;
  QStringBuilder<char16_t,_QStringView> *p;
  Initialization in_stack_ffffffffffffffbc;
  qsizetype in_stack_ffffffffffffffc0;
  QString *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p = in_RDI;
  bVar2 = isNull(in_RDI);
  if (bVar2) {
    QString::QString((QString *)0x9038cc);
  }
  else {
    QConcatenable<QStringBuilder<char16_t,_QStringView>_>::size(p);
    (in_RDI->b).m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->b).m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    this_00 = QString::data_ptr((QString *)in_RDI);
    QArrayDataPointer<char16_t>::data(this_00);
    QConcatenable<QStringBuilder<char16_t,_QStringView>_>::appendTo<QChar>
              (in_stack_ffffffffffffff98,(QChar **)0x90393e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QString *)p;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }